

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_grid.hpp
# Opt level: O2

ostream * multidim::_impl_multi_grid::operator<<(ostream *os,Grid<float,_4UL,_2UL,_3UL> *rhs)

{
  ostream *poVar1;
  size_t idx_00;
  size_t idx;
  _impl_multi_grid *this;
  ArrayCoord coord;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_60;
  unsigned_long local_50 [2];
  ostream *local_40;
  char *local_38;
  
  std::operator<<(os,"Values : [ ");
  local_38 = " ";
  local_40 = os;
  std::copy<float_const*,std::ostream_iterator<float,char,std::char_traits<char>>>
            ((float *)&coord,(float *)rhs,
             (ostream_iterator<float,_char,_std::char_traits<char>_> *)(rhs + 1));
  std::operator<<(os,"]\nMapping index to coord :\n");
  for (this = (_impl_multi_grid *)0x0; this != (_impl_multi_grid *)0x18; this = this + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::operator<<(poVar1,":{");
    unflatten_to_coordinates<float,4ul,2ul,3ul>(&coord,this,idx_00);
    local_60._M_string = ",";
    local_60._M_stream = os;
    std::copy<unsigned_long*,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
              (local_50,coord.data_,&local_60);
    poVar1 = std::operator<<(os,"}:");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,' ');
  }
  return os;
}

Assistant:

auto& operator<<(std::ostream &os, const Grid& rhs) 
    {
        os << "Values : [ ";
        std::copy(rhs.values_.begin(), rhs.values_.end(), 
            std::ostream_iterator<typename Grid::value_type>(os, " "));

        os << "]\nMapping index to coord :\n";
        for(size_t idx = 0; idx < rhs.prod_dims; idx ++) {
            os << idx << ":{";
            auto coord = rhs.unflatten(idx);
            std::copy(coord.begin(), coord.end(), 
                std::ostream_iterator<typename ArrayCoord::value_type>(os, ","));
            os << "}:" << rhs.flatten(coord) << ' ';
        }

        return os;
    }